

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O0

MPP_RET mpp_dec_notify_normal(MppDecImpl *dec,RK_U32 flag)

{
  RK_U32 RVar1;
  MppThread *this;
  bool bVar2;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  __sighandler_t __handler;
  RK_U32 old_flag;
  RK_U32 notify;
  MppThread *thd_dec;
  RK_U32 flag_local;
  MppDecImpl *dec_local;
  
  this = dec->thread_parser;
  bVar2 = false;
  if (this == (MppThread *)0x0) {
    dec_local._4_4_ = MPP_NOK;
  }
  else {
    MppThread::lock(this,THREAD_WORK);
    if (flag == 0x10000) {
      dec->parser_notify_flag = dec->parser_notify_flag | 0x10000;
      bVar2 = true;
    }
    else {
      RVar1 = dec->parser_notify_flag;
      dec->parser_notify_flag = flag | dec->parser_notify_flag;
      if ((RVar1 != dec->parser_notify_flag) &&
         ((dec->parser_notify_flag & dec->parser_wait_flag) != 0)) {
        bVar2 = true;
      }
    }
    if (bVar2) {
      __handler = extraout_RDX;
      if ((mpp_dec_debug & 0x80) != 0) {
        _mpp_log_l(4,"mpp_dec","%p status %08x notify control signal\n","mpp_dec_notify_normal",dec,
                   (ulong)dec->parser_wait_flag,dec->parser_notify_flag);
        __handler = extraout_RDX_00;
      }
      MppThread::signal(this,0,__handler);
    }
    MppThread::unlock(this,THREAD_WORK);
    dec_local._4_4_ = MPP_OK;
  }
  return dec_local._4_4_;
}

Assistant:

MPP_RET mpp_dec_notify_normal(MppDecImpl *dec, RK_U32 flag)
{
    MppThread *thd_dec  = dec->thread_parser;
    RK_U32 notify = 0;

    if (!thd_dec)
        return MPP_NOK;

    thd_dec->lock();
    if (flag == MPP_DEC_CONTROL) {
        dec->parser_notify_flag |= flag;
        notify = 1;
    } else {
        RK_U32 old_flag = dec->parser_notify_flag;

        dec->parser_notify_flag |= flag;
        if ((old_flag != dec->parser_notify_flag) &&
            (dec->parser_notify_flag & dec->parser_wait_flag))
            notify = 1;
    }

    if (notify) {
        dec_dbg_notify("%p status %08x notify control signal\n", dec,
                       dec->parser_wait_flag, dec->parser_notify_flag);
        thd_dec->signal();
    }
    thd_dec->unlock();

    return MPP_OK;
}